

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  unkuint9 Var7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  uint5 uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  ulong uVar15;
  uint8_t uVar16;
  uint uVar17;
  uint8_t *puVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  int I;
  uint uVar24;
  uint uVar25;
  uint8_t uVar26;
  uint uVar27;
  int L;
  uint uVar28;
  uint uVar29;
  uint8_t uVar30;
  short sVar31;
  undefined4 uVar32;
  short sVar43;
  short sVar44;
  undefined1 auVar35 [16];
  short sVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 uVar45;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 auVar52 [16];
  __m128i ABCDEFGH;
  int iVar55;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  undefined4 uVar61;
  undefined1 uVar67;
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined5 uVar33;
  undefined6 uVar34;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar56;
  undefined1 auVar63 [16];
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  
  uVar17 = *(uint *)top;
  auVar8[0xc] = (char)(uVar17 >> 0x18);
  auVar8._0_12_ = ZEXT712(0);
  uVar12 = CONCAT32(auVar8._10_3_,(ushort)(byte)(uVar17 >> 0x10));
  auVar14._5_8_ = 0;
  auVar14._0_5_ = uVar12;
  uVar32 = *(undefined4 *)(top + -5);
  uVar1 = (ulong)(ushort)uVar32 & 0xffffffffffff00ff;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)((uint)uVar32 >> 0x18);
  auVar10[8] = (char)((uint)uVar32 >> 0x10);
  auVar10._0_8_ = uVar1;
  auVar10[9] = 0;
  auVar10._10_3_ = auVar9._10_3_;
  auVar13._5_8_ = 0;
  auVar13._0_5_ = auVar10._8_5_;
  auVar11[4] = (char)((uint)uVar32 >> 8);
  auVar11._0_4_ = (int)uVar1;
  auVar11[5] = 0;
  auVar11._6_7_ = SUB137(auVar13 << 0x40,6);
  lVar20 = 0;
  do {
    *(uint *)(dst + lVar20 + 0x600) =
         ((uint)(uint3)(auVar9._10_3_ >> 0x10) + (uint)(uint3)(auVar8._10_3_ >> 0x10) +
          auVar11._4_4_ + (int)CONCAT72(SUB137(auVar14 << 0x40,6),(ushort)(byte)(uVar17 >> 8)) +
          auVar10._8_4_ + (int)uVar12 + (int)uVar1 + (uVar17 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0x80);
  puVar18 = dst + 0x604;
  uVar32 = *(undefined4 *)top;
  bVar3 = top[-1];
  lVar20 = 4;
  do {
    auVar35 = pshuflw(ZEXT416((uint)top[lVar20 + -6] - (uint)bVar3),
                      ZEXT416((uint)top[lVar20 + -6] - (uint)bVar3),0);
    sVar31 = auVar35._0_2_ + (ushort)(byte)uVar32;
    sVar40 = auVar35._2_2_ + (ushort)(byte)((uint)uVar32 >> 8);
    sVar43 = auVar35._4_2_ + (ushort)(byte)((uint)uVar32 >> 0x10);
    sVar44 = auVar35._6_2_ + (ushort)(byte)((uint)uVar32 >> 0x18);
    *(uint *)puVar18 =
         CONCAT13((0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44),
                  CONCAT12((0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43),
                           CONCAT11((0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40)
                                    ,(0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 -
                                     (0xff < sVar31))));
    puVar18 = puVar18 + 0x20;
    lVar20 = lVar20 + -1;
  } while (lVar20 != 0);
  uVar1 = *(ulong *)(top + -1);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar37._8_4_ = (int)uVar1;
  auVar37._0_8_ = uVar1;
  auVar37._12_4_ = (int)(uVar1 >> 0x20);
  uVar49 = (undefined1)(uVar1 >> 0x10);
  auVar46[0] = pavgb((char)uVar1,uVar49);
  uVar50 = (undefined1)(uVar1 >> 0x18);
  uVar45 = (undefined1)(uVar1 >> 8);
  auVar46[1] = pavgb(uVar45,uVar50);
  uVar51 = (undefined1)(uVar1 >> 0x20);
  auVar46[2] = pavgb(uVar49,uVar51);
  uVar41 = (undefined1)(uVar1 >> 0x28);
  auVar46[3] = pavgb(uVar50,uVar41);
  uVar56 = (undefined1)(uVar1 >> 0x30);
  auVar46[4] = pavgb(uVar51,uVar56);
  uVar42 = (undefined1)(uVar1 >> 0x38);
  auVar46[5] = pavgb(uVar41,uVar42);
  auVar46[6] = pavgb(uVar56,0);
  auVar46[7] = pavgb(uVar42,0);
  auVar46[8] = pavgb(0,0);
  auVar46[9] = pavgb(0,0);
  auVar46[10] = pavgb(0,0);
  auVar46[0xb] = pavgb(0,0);
  auVar46[0xc] = pavgb(0,0);
  auVar46[0xd] = pavgb(0,0);
  auVar46[0xe] = pavgb(0,0);
  auVar46[0xf] = pavgb(0,0);
  auVar35 = psubusb(auVar46,(auVar37 >> 0x50 ^ auVar35) & _DAT_0018abe0);
  uVar45 = pavgb(auVar35[0],uVar45);
  uVar49 = pavgb(auVar35[1],uVar49);
  uVar50 = pavgb(auVar35[2],uVar50);
  uVar51 = pavgb(auVar35[3],uVar51);
  pavgb(auVar35[4],uVar41);
  pavgb(auVar35[5],uVar56);
  pavgb(auVar35[6],uVar42);
  pavgb(auVar35[7],0);
  pavgb(auVar35[8],0);
  pavgb(auVar35[9],0);
  pavgb(auVar35[10],0);
  pavgb(auVar35[0xb],0);
  pavgb(auVar35[0xc],0);
  pavgb(auVar35[0xd],0);
  pavgb(auVar35[0xe],0);
  pavgb(auVar35[0xf],0);
  lVar20 = 0;
  do {
    *(uint *)(dst + lVar20 + 0x608) = CONCAT13(uVar51,CONCAT12(uVar50,CONCAT11(uVar49,uVar45)));
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0x80);
  uVar6 = *(ushort *)(top + -2);
  uVar24 = (uint)(byte)*(ushort *)(top + -2);
  uVar25 = (uint)top[-3];
  uVar17 = (uint)top[-4];
  bVar3 = top[-5];
  uVar27 = uVar25 + (uint)top[-1] + uVar24 * 2 + 2 >> 2;
  *(uint *)(dst + 0x60c) = uVar27 * 0x1010101;
  uVar19 = uVar24 + uVar25 * 2 + uVar17 + 2 >> 2;
  *(uint *)(dst + 0x62c) = uVar19 * 0x1010101;
  iVar21 = uVar25 + uVar17 * 2 + 2;
  *(uint *)(dst + 0x64c) = (iVar21 + (uint)bVar3 >> 2) * 0x1010101;
  uVar2 = (undefined8)*(unkuint9 *)(top + -5);
  uVar16 = top[3];
  Var7 = *(unkuint9 *)(top + -5);
  *(uint *)(dst + 0x66c) = (uVar17 + (uint)bVar3 * 3 + 2 >> 2) * 0x1010101;
  auVar35 = _DAT_0018abe0;
  uVar50 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar36[0] = pavgb(uVar50,(char)uVar2);
  uVar49 = (undefined1)((ulong)uVar2 >> 8);
  uVar51 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar36[1] = pavgb(uVar51,uVar49);
  uVar41 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar36[2] = pavgb(uVar41,uVar50);
  uVar56 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar36[3] = pavgb(uVar56,uVar51);
  uVar42 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar36[4] = pavgb(uVar42,uVar41);
  uVar45 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar36[5] = pavgb(uVar45,uVar56);
  auVar36[6] = pavgb(uVar16,uVar42);
  auVar36[7] = pavgb(0,uVar45);
  auVar36[8] = pavgb(0,uVar16);
  auVar36[9] = pavgb(0,0);
  auVar36[10] = pavgb(0,0);
  auVar36[0xb] = pavgb(0,0);
  auVar36[0xc] = pavgb(0,0);
  auVar36[0xd] = pavgb(0,0);
  auVar36[0xe] = pavgb(0,0);
  auVar36[0xf] = pavgb(0,0);
  auVar47._9_7_ = 0;
  auVar47._0_9_ = Var7 >> 0x10 ^ Var7;
  auVar37 = psubusb(auVar36,auVar47 & _DAT_0018abe0);
  uVar49 = pavgb(auVar37[0],uVar49);
  uVar50 = pavgb(auVar37[1],uVar50);
  uVar51 = pavgb(auVar37[2],uVar51);
  uVar41 = pavgb(auVar37[3],uVar41);
  uVar32 = CONCAT13(uVar41,CONCAT12(uVar51,CONCAT11(uVar50,uVar49)));
  uVar49 = pavgb(auVar37[4],uVar56);
  uVar33 = CONCAT14(uVar49,uVar32);
  uVar49 = pavgb(auVar37[5],uVar42);
  uVar34 = CONCAT15(uVar49,uVar33);
  uVar49 = pavgb(auVar37[6],uVar45);
  pavgb(auVar37[7],uVar16);
  pavgb(auVar37[8],0);
  pavgb(auVar37[9],0);
  pavgb(auVar37[10],0);
  pavgb(auVar37[0xb],0);
  pavgb(auVar37[0xc],0);
  pavgb(auVar37[0xd],0);
  pavgb(auVar37[0xe],0);
  pavgb(auVar37[0xf],0);
  uVar1 = *(ulong *)(top + -1);
  auVar57._0_8_ = uVar1 >> 8;
  auVar57._8_8_ = 0;
  uVar15 = uVar1 & 0xffffffffffff00;
  auVar59._8_8_ = uVar1 >> 0x38;
  auVar59._0_8_ = uVar15 << 8 | (ulong)uVar6;
  uVar51 = (undefined1)(uVar1 >> 8);
  auVar62[0] = pavgb((char)uVar6,uVar51);
  uVar41 = (undefined1)(uVar1 >> 0x10);
  auVar62[1] = pavgb((char)(uVar6 >> 8),uVar41);
  uVar56 = (undefined1)(uVar1 >> 0x18);
  auVar62[2] = pavgb((char)(uVar15 >> 8),uVar56);
  uVar42 = (undefined1)(uVar1 >> 0x20);
  auVar62[3] = pavgb((char)(uVar15 >> 0x10),uVar42);
  uVar45 = (undefined1)(uVar1 >> 0x28);
  auVar62[4] = pavgb((char)(uVar15 >> 0x18),uVar45);
  uVar53 = (undefined1)(uVar1 >> 0x30);
  auVar62[5] = pavgb((char)(uVar15 >> 0x20),uVar53);
  uVar54 = (undefined1)(uVar1 >> 0x38);
  auVar62[6] = pavgb((char)(uVar15 >> 0x28),uVar54);
  auVar62[7] = pavgb((char)(uVar15 >> 0x30),0);
  auVar62[8] = pavgb(uVar54,0);
  auVar62[9] = pavgb(0,0);
  auVar62[10] = pavgb(0,0);
  auVar62[0xb] = pavgb(0,0);
  auVar62[0xc] = pavgb(0,0);
  auVar62[0xd] = pavgb(0,0);
  auVar62[0xe] = pavgb(0,0);
  auVar62[0xf] = pavgb(0,0);
  auVar37 = psubusb(auVar62,(auVar59 ^ auVar57) & _DAT_0018abe0);
  uVar50 = pavgb(auVar37[0],(char)uVar1);
  uVar64 = pavgb(auVar37[1],uVar51);
  uVar65 = pavgb(auVar37[2],uVar41);
  uVar66 = pavgb(auVar37[3],uVar56);
  iVar60 = CONCAT13(uVar66,CONCAT12(uVar65,CONCAT11(uVar64,uVar50)));
  pavgb(auVar37[4],uVar42);
  pavgb(auVar37[5],uVar45);
  pavgb(auVar37[6],uVar53);
  pavgb(auVar37[7],uVar54);
  pavgb(auVar37[8],0);
  pavgb(auVar37[9],0);
  pavgb(auVar37[10],0);
  pavgb(auVar37[0xb],0);
  pavgb(auVar37[0xc],0);
  pavgb(auVar37[0xd],0);
  pavgb(auVar37[0xe],0);
  pavgb(auVar37[0xf],0);
  uVar50 = pavgb((char)uVar1,uVar51);
  uVar51 = pavgb(uVar51,uVar41);
  uVar41 = pavgb(uVar41,uVar56);
  uVar56 = pavgb(uVar56,uVar42);
  iVar55 = CONCAT13(uVar56,CONCAT12(uVar41,CONCAT11(uVar51,uVar50)));
  pavgb(uVar42,uVar45);
  pavgb(uVar45,uVar53);
  pavgb(uVar53,uVar54);
  pavgb(uVar54,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  *(ulong *)(dst + 0x610) = CONCAT44(iVar55,(int)(CONCAT16(uVar49,uVar34) >> 0x18));
  *(ulong *)(dst + 0x630) = CONCAT44(iVar60,(int)((uint6)uVar34 >> 0x10));
  *(ulong *)(dst + 0x650) = CONCAT44(iVar55 << 8,(int)((uint5)uVar33 >> 8));
  *(ulong *)(dst + 0x670) = CONCAT44(iVar60 << 8,uVar32);
  dst[0x654] = (uint8_t)uVar27;
  uVar26 = (uint8_t)(uVar24 + uVar17 + 2 + uVar25 * 2 >> 2);
  dst[0x674] = uVar26;
  uVar1 = *(ulong *)top;
  auVar38._0_8_ = uVar1 >> 8;
  auVar38._8_8_ = 0;
  auVar58._8_4_ = (int)uVar1;
  auVar58._0_8_ = uVar1;
  auVar58._12_4_ = (int)(uVar1 >> 0x20);
  uVar42 = (undefined1)(uVar1 >> 0x10);
  auVar48[0] = pavgb((char)uVar1,uVar42);
  uVar50 = (undefined1)(uVar1 >> 8);
  uVar45 = (undefined1)(uVar1 >> 0x18);
  auVar48[1] = pavgb(uVar50,uVar45);
  uVar53 = (undefined1)(uVar1 >> 0x20);
  auVar48[2] = pavgb(uVar42,uVar53);
  uVar54 = (undefined1)(uVar1 >> 0x28);
  auVar48[3] = pavgb(uVar45,uVar54);
  uVar64 = (undefined1)(uVar1 >> 0x30);
  auVar48[4] = pavgb(uVar53,uVar64);
  uVar65 = (undefined1)(uVar1 >> 0x38);
  auVar48[5] = pavgb(uVar54,uVar65);
  auVar48[6] = pavgb(uVar64,top[7]);
  auVar48[7] = pavgb(uVar65,0);
  auVar48[8] = pavgb(0,0);
  auVar48[9] = pavgb(0,0);
  auVar48[10] = pavgb(0,0);
  auVar48[0xb] = pavgb(0,0);
  auVar48[0xc] = pavgb(0,0);
  auVar48[0xd] = pavgb(0,0);
  auVar48[0xe] = pavgb(0,0);
  auVar48[0xf] = pavgb(0,0);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (auVar58._8_8_ >> 0x10 | (ulong)top[7] << 0x30) ^ uVar1;
  auVar37 = psubusb(auVar48,auVar52 & auVar35);
  uVar49 = pavgb(auVar37[0],uVar50);
  uVar51 = pavgb(auVar37[1],uVar42);
  uVar41 = pavgb(auVar37[2],uVar45);
  uVar56 = pavgb(auVar37[3],uVar53);
  uVar32 = CONCAT13(uVar56,CONCAT12(uVar41,CONCAT11(uVar51,uVar49)));
  uVar49 = pavgb(auVar37[4],uVar54);
  uVar33 = CONCAT14(uVar49,uVar32);
  uVar49 = pavgb(auVar37[5],uVar64);
  uVar34 = CONCAT15(uVar49,uVar33);
  uVar49 = pavgb(auVar37[6],uVar65);
  pavgb(auVar37[7],0);
  pavgb(auVar37[8],0);
  pavgb(auVar37[9],0);
  pavgb(auVar37[10],0);
  pavgb(auVar37[0xb],0);
  pavgb(auVar37[0xc],0);
  pavgb(auVar37[0xd],0);
  pavgb(auVar37[0xe],0);
  pavgb(auVar37[0xf],0);
  uVar51 = pavgb((char)uVar1,uVar50);
  uVar41 = pavgb(uVar50,uVar42);
  uVar56 = pavgb(uVar42,uVar45);
  uVar66 = pavgb(uVar45,uVar53);
  uVar61 = CONCAT13(uVar66,CONCAT12(uVar56,CONCAT11(uVar41,uVar51)));
  uVar67 = pavgb(uVar53,uVar54);
  auVar63._0_5_ = CONCAT14(uVar67,uVar61);
  auVar63[5] = pavgb(uVar54,uVar64);
  auVar63[6] = pavgb(uVar64,uVar65);
  auVar63[7] = pavgb(uVar65,0);
  auVar63[8] = pavgb(0,0);
  auVar63[9] = pavgb(0,0);
  auVar63[10] = pavgb(0,0);
  auVar63[0xb] = pavgb(0,0);
  auVar63[0xc] = pavgb(0,0);
  auVar63[0xd] = pavgb(0,0);
  auVar63[0xe] = pavgb(0,0);
  auVar63[0xf] = pavgb(0,0);
  auVar68[0] = pavgb(uVar42,uVar50);
  auVar68[1] = pavgb(uVar45,uVar42);
  auVar68[2] = pavgb(uVar53,uVar45);
  auVar68[3] = pavgb(uVar54,uVar53);
  auVar68[4] = pavgb(uVar64,uVar54);
  auVar68[5] = pavgb(uVar65,uVar64);
  auVar68[6] = pavgb(0,uVar65);
  auVar68[7] = pavgb(0,0);
  auVar68[8] = pavgb(0,0);
  auVar68[9] = pavgb(0,0);
  auVar68[10] = pavgb(0,0);
  auVar68[0xb] = pavgb(0,0);
  auVar68[0xc] = pavgb(0,0);
  auVar68[0xd] = pavgb(0,0);
  auVar68[0xe] = pavgb(0,0);
  auVar68[0xf] = pavgb(0,0);
  auVar69[0] = pavgb(uVar51,auVar68[0]);
  auVar69[1] = pavgb(uVar41,auVar68[1]);
  auVar69[2] = pavgb(uVar56,auVar68[2]);
  auVar69[3] = pavgb(uVar66,auVar68[3]);
  auVar69[4] = pavgb(uVar67,auVar68[4]);
  auVar69[5] = pavgb(auVar63[5],auVar68[5]);
  auVar69[6] = pavgb(auVar63[6],auVar68[6]);
  auVar69[7] = pavgb(auVar63[7],auVar68[7]);
  auVar69[8] = pavgb(auVar63[8],auVar68[8]);
  auVar69[9] = pavgb(auVar63[9],auVar68[9]);
  auVar69[10] = pavgb(auVar63[10],auVar68[10]);
  auVar69[0xb] = pavgb(auVar63[0xb],auVar68[0xb]);
  auVar69[0xc] = pavgb(auVar63[0xc],auVar68[0xc]);
  auVar69[0xd] = pavgb(auVar63[0xd],auVar68[0xd]);
  auVar69[0xe] = pavgb(auVar63[0xe],auVar68[0xe]);
  auVar69[0xf] = pavgb(auVar63[0xf],auVar68[0xf]);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar38._0_8_ ^ uVar1;
  auVar35 = psubusb(auVar69,(auVar39 | auVar58 >> 0x50 ^ auVar38) & (auVar68 ^ auVar63) & auVar35);
  *(ulong *)(dst + 0x618) = CONCAT44(uVar61,uVar32);
  *(ulong *)(dst + 0x638) = CONCAT44(auVar35._0_4_,(int)((uint5)uVar33 >> 8));
  *(ulong *)(dst + 0x658) = CONCAT44((int)((uint5)auVar63._0_5_ >> 8),(int)((uint6)uVar34 >> 0x10));
  *(ulong *)(dst + 0x678) = CONCAT44(auVar35._1_4_,(int)(CONCAT16(uVar49,uVar34) >> 0x18));
  dst[0x65f] = auVar35[4];
  dst[0x67f] = auVar35[5];
  uVar27 = (uint)top[-1];
  bVar3 = top[-5];
  uVar28 = (uint)bVar3;
  uVar29 = (uint)*top;
  bVar4 = top[1];
  bVar5 = top[2];
  uVar16 = (uint8_t)(uVar24 + uVar27 + 1 >> 1);
  dst[0x6a2] = uVar16;
  dst[0x680] = uVar16;
  uVar23 = (uint8_t)(uVar25 + uVar24 + 1 >> 1);
  dst[0x6c2] = uVar23;
  dst[0x6a0] = uVar23;
  uVar22 = (uint8_t)(uVar25 + uVar17 + 1 >> 1);
  dst[0x6e2] = uVar22;
  dst[0x6c0] = uVar22;
  uVar30 = (uint8_t)(uVar17 + uVar28 + 1 >> 1);
  dst[0x6e0] = uVar30;
  dst[0x683] = (uint8_t)(uVar29 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x682] = (uint8_t)(uVar27 + uVar29 * 2 + 2 + (uint)bVar4 >> 2);
  uVar16 = (uint8_t)(uVar24 + uVar27 * 2 + 2 + uVar29 >> 2);
  dst[0x6a3] = uVar16;
  dst[0x681] = uVar16;
  uVar16 = (uint8_t)(uVar25 + uVar24 * 2 + uVar27 + 2 >> 2);
  dst[0x6c3] = uVar16;
  dst[0x6a1] = uVar16;
  dst[0x6e3] = uVar26;
  dst[0x6c1] = uVar26;
  uVar16 = (uint8_t)(iVar21 + uVar28 >> 2);
  dst[0x6e1] = uVar16;
  dst[0x684] = uVar23;
  dst[0x6a4] = uVar22;
  dst[0x686] = uVar22;
  dst[0x6c4] = uVar30;
  dst[0x6a6] = uVar30;
  dst[0x685] = (uint8_t)uVar19;
  dst[0x6a5] = uVar16;
  dst[0x687] = uVar16;
  uVar16 = (uint8_t)(uVar17 + uVar28 * 3 + 2 >> 2);
  dst[0x6c5] = uVar16;
  dst[0x6a7] = uVar16;
  auVar35 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
  *(int *)(dst + 0x6e4) = auVar35._0_4_;
  dst[0x6c6] = bVar3;
  dst[0x6c7] = bVar3;
  return;
}

Assistant:

static void Intra4Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                             const uint8_t* WEBP_RESTRICT top) {
  DC4_SSE2(I4DC4 + dst, top);
  TM4_SSE2(I4TM4 + dst, top);
  VE4_SSE2(I4VE4 + dst, top);
  HE4_SSE2(I4HE4 + dst, top);
  RD4_SSE2(I4RD4 + dst, top);
  VR4_SSE2(I4VR4 + dst, top);
  LD4_SSE2(I4LD4 + dst, top);
  VL4_SSE2(I4VL4 + dst, top);
  HD4_SSE2(I4HD4 + dst, top);
  HU4_SSE2(I4HU4 + dst, top);
}